

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.h
# Opt level: O2

int __thiscall btSimpleBroadphase::allocHandle(btSimpleBroadphase *this)

{
  int iVar1;
  
  iVar1 = this->m_firstFreeHandle;
  this->m_firstFreeHandle = *(int *)&this->m_pHandles[iVar1].super_btBroadphaseProxy.field_0x3c;
  this->m_numHandles = this->m_numHandles + 1;
  if (this->m_LastHandleIndex < iVar1) {
    this->m_LastHandleIndex = iVar1;
  }
  return iVar1;
}

Assistant:

int allocHandle()
	{
		btAssert(m_numHandles < m_maxHandles);
		int freeHandle = m_firstFreeHandle;
		m_firstFreeHandle = m_pHandles[freeHandle].GetNextFree();
		m_numHandles++;
		if(freeHandle > m_LastHandleIndex)
		{
			m_LastHandleIndex = freeHandle;
		}
		return freeHandle;
	}